

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O3

void __thiscall duckdb::CatalogSet::CleanupEntry(CatalogSet *this,CatalogEntry *catalog_entry)

{
  CatalogEntry *entry;
  int iVar1;
  mutex *__mutex;
  
  __mutex = &this->catalog->write_lock;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 != 0) {
    ::std::__throw_system_error(iVar1);
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->catalog_lock);
  if (iVar1 == 0) {
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&catalog_entry->parent);
    entry = (catalog_entry->parent).ptr;
    CatalogEntryMap::DropEntry(&this->map,catalog_entry);
    if (((entry->deleted == true) &&
        ((entry->child).
         super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
         super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
         super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl == (CatalogEntry *)0x0))
       && ((entry->parent).ptr == (CatalogEntry *)0x0)) {
      CatalogEntryMap::DropEntry(&this->map,entry);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->catalog_lock);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void CatalogSet::CleanupEntry(CatalogEntry &catalog_entry) {
	// destroy the backed up entry: it is no longer required
	lock_guard<mutex> write_lock(catalog.GetWriteLock());
	lock_guard<mutex> lock(catalog_lock);
	auto &parent = catalog_entry.Parent();
	map.DropEntry(catalog_entry);
	if (parent.deleted && !parent.HasChild() && !parent.HasParent()) {
		// The entry's parent is a tombstone and the entry had no child
		// clean up the mapping and the tombstone entry as well
		D_ASSERT(map.GetEntry(parent.name).get() == &parent);
		map.DropEntry(parent);
	}
}